

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
          (void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunction *in_RDI;
  aggregate_destructor_t unaff_retaddr;
  aggregate_statistics_t in_stack_00000008;
  aggregate_window_t in_stack_00000010;
  aggregate_serialize_t in_stack_00000018;
  aggregate_deserialize_t in_stack_00000020;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee0;
  LogicalType *local_b8;
  LogicalType local_90 [8];
  aggregate_update_t in_stack_ffffffffffffff78;
  aggregate_initialize_t in_stack_ffffffffffffff80;
  aggregate_size_t in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  LogicalType *this;
  AggregateFunction *in_stack_ffffffffffffffa0;
  LogicalType local_48 [24];
  undefined1 *local_30;
  undefined8 local_28;
  aggregate_combine_t in_stack_ffffffffffffffe0;
  aggregate_finalize_t in_stack_ffffffffffffffe8;
  aggregate_simple_update_t in_stack_fffffffffffffff0;
  AggregateFunction *bind;
  
  bind = in_RDI;
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffa0,ANY);
  this = local_48;
  duckdb::LogicalType::LogicalType(this,ANY);
  local_30 = &stack0xffffffffffffffa0;
  local_28 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x89c13b);
  iVar1._M_len = in_stack_fffffffffffffee0;
  iVar1._M_array = in_stack_fffffffffffffed8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  duckdb::LogicalType::LogicalType(local_90,ANY);
  AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffffa0,(vector<duckdb::LogicalType,_true> *)this,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
             in_stack_fffffffffffffff0,(bind_aggregate_function_t)bind,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  duckdb::LogicalType::~LogicalType(local_90);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x89c222);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x89c22f);
  local_b8 = (LogicalType *)&local_30;
  do {
    local_b8 = local_b8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_b8);
  } while (local_b8 != (LogicalType *)&stack0xffffffffffffffa0);
  return in_RDI;
}

Assistant:

AggregateFunction GetGenericArgMinMaxFunction() {
	using STATE = ArgMinMaxState<string_t, string_t>;
	return AggregateFunction(
	    {LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, AggregateFunction::StateSize<STATE>,
	    AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>, OP::template Update<STATE>,
	    AggregateFunction::StateCombine<STATE, OP>, AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, OP::Bind,
	    AggregateFunction::StateDestroy<STATE, OP>);
}